

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::javanano::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,EnumDescriptor *descriptor)

{
  bool bVar1;
  Params *pPVar2;
  string *name;
  FileDescriptor *file;
  Descriptor *parent;
  EnumDescriptor *descriptor_local;
  Params *params_local;
  
  pPVar2 = (Params *)EnumDescriptor::containing_type((EnumDescriptor *)params);
  bVar1 = Params::java_enum_style((Params *)this);
  if (bVar1) {
    name = EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)params);
    file = EnumDescriptor::file((EnumDescriptor *)params);
    ToJavaName(__return_storage_ptr__,(Params *)this,name,true,(Descriptor *)pPVar2,file);
  }
  else if (pPVar2 == (Params *)0x0) {
    pPVar2 = (Params *)EnumDescriptor::file((EnumDescriptor *)params);
    ClassName_abi_cxx11_(__return_storage_ptr__,this,pPVar2,(FileDescriptor *)descriptor);
  }
  else {
    ClassName_abi_cxx11_(__return_storage_ptr__,this,pPVar2,(Descriptor *)descriptor);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Params& params, const EnumDescriptor* descriptor) {
  const Descriptor* parent = descriptor->containing_type();
  // When using Java enum style, an enum's class name contains the enum name.
  // Use the standard ToJavaName translation.
  if (params.java_enum_style()) {
    return ToJavaName(params, descriptor->name(), true, parent,
                      descriptor->file());
  }
  // Otherwise the enum members are accessed from the enclosing class.
  if (parent != NULL) {
    return ClassName(params, parent);
  } else {
    return ClassName(params, descriptor->file());
  }
}